

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderExecuteTest.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Functional::ShaderExecuteTest::init(ShaderExecuteTest *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  int extraout_EAX;
  int i;
  long lVar2;
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> children;
  ShaderLibrary shaderLibrary;
  string fileName;
  allocator<char> local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  ShaderLibrary local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::ShaderLibrary::ShaderLibrary
            (&local_68,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             pCVar1->m_renderCtx,pCVar1->m_contextInfo);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"shaders/",&local_89);
  std::operator+(&local_88,&local_50,
                 (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_name._M_dataplus.
                 _M_p);
  std::operator+(&local_30,&local_88,".test");
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_50);
  deqp::gls::ShaderLibrary::loadShaderFile
            ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)&local_88,&local_68,
             local_30._M_dataplus._M_p);
  for (lVar2 = 0; lVar2 < (int)(local_88._M_string_length - (long)local_88._M_dataplus._M_p >> 3);
      lVar2 = lVar2 + 1) {
    tcu::TestNode::addChild((TestNode *)this,*(TestNode **)(local_88._M_dataplus._M_p + lVar2 * 8));
  }
  std::_Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::~_Vector_base
            ((_Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)&local_88);
  std::__cxx11::string::~string((string *)&local_30);
  deqp::gls::ShaderLibrary::~ShaderLibrary(&local_68);
  return extraout_EAX;
}

Assistant:

void ShaderExecuteTest::init (void)
{
	// Test code.
	gls::ShaderLibrary	shaderLibrary(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo());
	string				fileName	= string("shaders/") + getName() + ".test";
	vector<TestNode*>	children	= shaderLibrary.loadShaderFile(fileName.c_str());

	for (int i = 0; i < (int)children.size(); i++)
		addChild(children[i]);
}